

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<double>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<double> *accessor)

{
  DataChunk *result_00;
  double input;
  CURSOR *pCVar1;
  bool bVar2;
  reference pvVar3;
  InvalidInputException *this_00;
  duckdb *this_01;
  double result_1;
  double local_48;
  string local_40;
  
  pCVar1 = accessor->data;
  if (((pCVar1->scan).next_row_index <= lidx) || (lidx < (pCVar1->scan).current_row_index)) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (double *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar1->validity = &pvVar3->validity;
  }
  input = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)];
  this_01 = (duckdb *)0x0;
  bVar2 = TryCast::Operation<double,double>(input,&local_48,false);
  if (bVar2) {
    return local_48;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,double>(&local_40,this_01,input);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}